

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.cpp
# Opt level: O0

int __thiscall ezc3d::ParametersNS::Parameters::remove(Parameters *this,char *__filename)

{
  vector<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
  *pvVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  iterator iVar2;
  __normal_iterator<const_ezc3d::ParametersNS::GroupNS::Group_*,_std::vector<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>_>
  *in_stack_fffffffffffffee0;
  const_iterator in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 uVar3;
  string local_30 [32];
  char *local_10;
  Parameters *local_8;
  
  local_10 = __filename;
  local_8 = this;
  pvVar1 = (vector<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
            *)nbGroups((Parameters *)0x174116);
  if (pvVar1 <= __filename) {
    uVar3 = 1;
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x10);
    std::__cxx11::to_string(CONCAT17(uVar3,in_stack_ffffffffffffff18));
    std::operator+((char *)this,__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (char *)__rhs);
    nbGroups((Parameters *)0x174192);
    std::__cxx11::to_string(CONCAT17(uVar3,in_stack_ffffffffffffff18));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar3,in_stack_ffffffffffffff18),in_stack_ffffffffffffff10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (char *)__rhs);
    std::out_of_range::out_of_range((out_of_range *)__rhs,local_30);
    __cxa_throw(__rhs,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  pvVar1 = &this->_groups;
  std::
  vector<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
  ::begin(pvVar1);
  __gnu_cxx::
  __normal_iterator<ezc3d::ParametersNS::GroupNS::Group_*,_std::vector<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>_>
  ::operator+((__normal_iterator<ezc3d::ParametersNS::GroupNS::Group_*,_std::vector<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>_>
               *)this,(difference_type)in_stack_fffffffffffffee0);
  __gnu_cxx::
  __normal_iterator<ezc3d::ParametersNS::GroupNS::Group_const*,std::vector<ezc3d::ParametersNS::GroupNS::Group,std::allocator<ezc3d::ParametersNS::GroupNS::Group>>>
  ::__normal_iterator<ezc3d::ParametersNS::GroupNS::Group*>
            (in_stack_fffffffffffffee0,
             (__normal_iterator<ezc3d::ParametersNS::GroupNS::Group_*,_std::vector<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>_>
              *)pvVar1);
  iVar2 = std::
          vector<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
          ::erase((vector<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
                   *)__filename,in_stack_fffffffffffffef8);
  return (int)iVar2._M_current;
}

Assistant:

void ezc3d::ParametersNS::Parameters::remove(size_t idx) {
  if (idx >= nbGroups()) {
    throw std::out_of_range(
        "Parameters::group method is trying to access the group " +
        std::to_string(idx) + " while the maximum number of groups is " +
        std::to_string(nbGroups()) + ".");
  }
  _groups.erase(_groups.begin() + idx);
}